

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O2

_Bool mon_take_nonplayer_hit
                (wchar_t dam,monster_conflict *t_mon,mon_messages hurt_msg,mon_messages die_msg)

{
  byte *pbVar1;
  player_upkeep *ppVar2;
  _Bool _Var3;
  short sVar4;
  
  if (t_mon != (monster_conflict *)0x0) {
    _Var3 = monster_is_unique((monster *)t_mon);
    ppVar2 = player->upkeep;
    if (((_Var3) || (ppVar2->arena_level == true)) && (t_mon->hp < dam)) {
      dam = (int)t_mon->hp;
    }
    if ((monster_conflict *)ppVar2->health_who == t_mon) {
      pbVar1 = (byte *)((long)&ppVar2->redraw + 1);
      *pbVar1 = *pbVar1 | 2;
    }
    monster_wake(t_mon,false,L'\0');
    sVar4 = t_mon->hp - (short)dam;
    t_mon->hp = sVar4;
    if (sVar4 < 0) {
      add_monster_message(t_mon,die_msg,false);
      monster_death(t_mon,player,false);
      delete_monster_idx((chunk *)cave,t_mon->midx);
    }
    else {
      _Var3 = monster_is_camouflaged((monster *)t_mon);
      if (!_Var3) {
        if (hurt_msg == MON_MSG_NONE) {
          if (L'\0' < dam) {
            message_pain(t_mon,dam);
          }
        }
        else {
          add_monster_message(t_mon,hurt_msg,false);
        }
      }
      if ((L'\0' < dam) && (t_mon->m_timed[3] == 0)) {
        monster_scared_by_damage(t_mon,dam);
      }
    }
    return SUB21((ushort)sVar4 >> 0xf,0);
  }
  __assert_fail("t_mon",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-util.c"
                ,0x4ab,
                "_Bool mon_take_nonplayer_hit(int, struct monster *, enum mon_messages, enum mon_messages)"
               );
}

Assistant:

bool mon_take_nonplayer_hit(int dam, struct monster *t_mon,
							enum mon_messages hurt_msg,
							enum mon_messages die_msg)
{
	assert(t_mon);

	/* "Unique" or arena monsters can only be "killed" by the player */
	if (monster_is_unique(t_mon) || player->upkeep->arena_level) {
		/* Reduce monster hp to zero, but don't kill it. */
		if (dam > t_mon->hp) dam = t_mon->hp;
	}

	/* Redraw (later) if needed */
	if (player->upkeep->health_who == t_mon)
		player->upkeep->redraw |= (PR_HEALTH);

	/* Wake the monster up, doesn't become aware of the player */
	monster_wake(t_mon, false, 0);

	/* Hurt the monster */
	t_mon->hp -= dam;

	/* Dead or damaged monster */
	if (t_mon->hp < 0) {
		/* Death message */
		add_monster_message(t_mon, die_msg, false);

		/* Generate treasure, etc */
		monster_death(t_mon, player, false);

		/* Delete the monster */
		delete_monster_idx(cave, t_mon->midx);
		return true;
	} else if (!monster_is_camouflaged(t_mon)) {
		/* Give detailed messages if visible */
		if (hurt_msg != MON_MSG_NONE) {
			add_monster_message(t_mon, hurt_msg, false);
		} else if (dam > 0) {
			message_pain(t_mon, dam);
		}
	}

	/* Sometimes a monster gets scared by damage */
	if (!t_mon->m_timed[MON_TMD_FEAR] && dam > 0) {
		(void) monster_scared_by_damage(t_mon, dam);
	}

	return false;
}